

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

string * __thiscall
arangodb::velocypack::Builder::toString_abi_cxx11_(string *__return_storage_ptr__,Builder *this)

{
  uint8_t *slice;
  StringSink sink;
  Options local_58;
  Sink local_28;
  string *local_20;
  
  local_58.unsupportedTypeBehavior = FailOnUnsupportedType;
  local_58.paddingBehavior = Flexible;
  local_58.buildUnindexedArrays = false;
  local_58.buildUnindexedObjects = false;
  local_58.singleLinePrettyPrint = false;
  local_58.keepTopLevelOpen = false;
  local_58.attributeTranslator = (AttributeTranslator *)0x0;
  local_58.customTypeHandler._0_5_ = 0;
  local_58.customTypeHandler._5_3_ = 0;
  local_58.clearBuilderBeforeParse = true;
  local_58.validateUtf8Strings = false;
  local_58.checkAttributeUniqueness = false;
  local_58.escapeForwardSlashes = false;
  local_58.escapeControl = true;
  local_58.escapeUnicode = false;
  local_58.dumpAttributesInIndexOrder = true;
  local_58.unsupportedDoublesAsString = false;
  local_58.binaryAsHex = false;
  local_58.datesAsIntegers = false;
  local_58.disallowExternals = false;
  local_58.disallowCustom = false;
  local_58.disallowTags = false;
  local_58.disallowBCD = false;
  local_58.debugTags = false;
  local_58.nestingLimit = 0xffffffff;
  local_58.prettyPrint = true;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_28._vptr_Sink = (_func_int **)&PTR__Sink_0011bc88;
  local_20 = __return_storage_ptr__;
  if (this->_pos == 0) {
    slice = "";
  }
  else {
    slice = start(this);
  }
  Dumper::dump((Slice)slice,&local_28,&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Builder::toString() const {
  Options opts;
  opts.prettyPrint = true;

  std::string buffer;
  StringSink sink(&buffer);
  Dumper::dump(slice(), &sink, &opts);
  return buffer;
}